

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O0

void dispatch_notification(gpioReport_t *r)

{
  uint uVar1;
  long in_RDI;
  int g;
  int l;
  uint32_t changed;
  callback_t *p;
  uint local_18;
  callback_t *local_10;
  
  if (*(short *)(in_RDI + 2) == 0) {
    uVar1 = (*(uint *)(in_RDI + 8) ^ gLastLevel) & gNotifyBits;
    gLastLevel = *(uint32_t *)(in_RDI + 8);
    for (local_10 = gCallBackFirst; local_10 != (callback_t *)0x0; local_10 = local_10->next) {
      if (((uVar1 & 1 << ((byte)local_10->gpio & 0x1f)) != 0) &&
         (local_18 = (uint)((*(uint *)(in_RDI + 8) & 1 << ((byte)local_10->gpio & 0x1f)) != 0),
         local_10->edge != local_18)) {
        if (local_10->ex == 0) {
          (*local_10->f)((ulong)(uint)local_10->gpio,(ulong)local_18,(ulong)*(uint *)(in_RDI + 4));
        }
        else {
          (*local_10->f)((ulong)(uint)local_10->gpio,(ulong)local_18,(ulong)*(uint *)(in_RDI + 4),
                         local_10->user);
        }
      }
    }
  }
  else {
    uVar1 = *(ushort *)(in_RDI + 2) & 0x1f;
    for (local_10 = gCallBackFirst; local_10 != (callback_t *)0x0; local_10 = local_10->next) {
      if (local_10->gpio == uVar1) {
        if (local_10->ex == 0) {
          (*local_10->f)((ulong)uVar1,2,(ulong)*(uint *)(in_RDI + 4));
        }
        else {
          (*local_10->f)((ulong)uVar1,2,(ulong)*(uint *)(in_RDI + 4),local_10->user);
        }
      }
    }
  }
  return;
}

Assistant:

static void dispatch_notification(gpioReport_t *r)
{
   callback_t *p;
   uint32_t changed;
   int l, g;

   /*
   printf("s=%d f=%d l=%8X, t=%10u\n",
      r->seqno, r->flags, r->level, r->tick);
   */

   if (r->flags == 0)
   {
      changed = (r->level ^ gLastLevel) & gNotifyBits;

      gLastLevel = r->level;

      p = gCallBackFirst;

      while (p)
      {
         if (changed & (1<<(p->gpio)))
         {
            if ((r->level) & (1<<(p->gpio))) l = 1; else l = 0;
            if ((p->edge) ^ l)
            {
               if (p->ex) (p->f)(p->gpio, l, r->tick, p->user);
               else       (p->f)(p->gpio, l, r->tick);
            }
         }
         p = p->next;
      }
   }
   else
   {
      g = (r->flags) & 31;

      p = gCallBackFirst;

      while (p)
      {
         if ((p->gpio) == g)
         {
            if (p->ex) (p->f)(g, PI_TIMEOUT, r->tick, p->user);
            else       (p->f)(g, PI_TIMEOUT, r->tick);
         }
         p = p->next;
      }
   }
}